

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error PVG_FT_Stroker_EndSubPath(PVG_FT_Stroker stroker)

{
  PVG_FT_Error PVar1;
  PVG_FT_Angle PVar2;
  uint local_2c;
  PVG_FT_Int inside_side;
  PVG_FT_Angle turn;
  PVG_FT_StrokeBorder right;
  PVG_FT_Error error;
  PVG_FT_Stroker stroker_local;
  
  right._4_4_ = 0;
  if (stroker->subpath_open == '\0') {
    if ((((stroker->center).x == (stroker->subpath_start).x) &&
        ((stroker->center).y == (stroker->subpath_start).y)) ||
       (right._4_4_ = PVG_FT_Stroker_LineTo(stroker,&stroker->subpath_start), right._4_4_ == 0)) {
      stroker->angle_out = stroker->subpath_angle;
      PVar2 = PVG_FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
      if (PVar2 != 0) {
        local_2c = (uint)(PVar2 < 0);
        PVar1 = ft_stroker_inside(stroker,local_2c,stroker->subpath_line_length);
        if (PVar1 != 0) {
          return PVar1;
        }
        right._4_4_ = ft_stroker_outside(stroker,1 - local_2c,stroker->subpath_line_length);
        if (right._4_4_ != 0) {
          return right._4_4_;
        }
      }
      ft_stroke_border_close(stroker->borders,'\0');
      ft_stroke_border_close(stroker->borders + 1,'\x01');
    }
  }
  else {
    right._4_4_ = ft_stroker_cap(stroker,stroker->angle_in,0);
    if ((right._4_4_ == 0) &&
       (right._4_4_ = ft_stroker_add_reverse_left(stroker,'\x01'), right._4_4_ == 0)) {
      (stroker->center).x = (stroker->subpath_start).x;
      (stroker->center).y = (stroker->subpath_start).y;
      right._4_4_ = ft_stroker_cap(stroker,stroker->subpath_angle + 0xb40000,0);
      if (right._4_4_ == 0) {
        ft_stroke_border_close(stroker->borders,'\0');
      }
    }
  }
  return right._4_4_;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_EndSubPath(PVG_FT_Stroker stroker)
{
    PVG_FT_Error error = 0;

    if (stroker->subpath_open) {
        PVG_FT_StrokeBorder right = stroker->borders;

        /* All right, this is an opened path, we need to add a cap between */
        /* right & left, add the reverse of left, then add a final cap     */
        /* between left & right.                                           */
        error = ft_stroker_cap(stroker, stroker->angle_in, 0);
        if (error) goto Exit;

        /* add reversed points from `left' to `right' */
        error = ft_stroker_add_reverse_left(stroker, TRUE);
        if (error) goto Exit;

        /* now add the final cap */
        stroker->center = stroker->subpath_start;
        error =
            ft_stroker_cap(stroker, stroker->subpath_angle + PVG_FT_ANGLE_PI, 0);
        if (error) goto Exit;

        /* Now end the right subpath accordingly.  The left one is */
        /* rewind and doesn't need further processing.             */
        ft_stroke_border_close(right, FALSE);
    } else {
        PVG_FT_Angle turn;
        PVG_FT_Int   inside_side;

        /* close the path if needed */
        if (stroker->center.x != stroker->subpath_start.x ||
            stroker->center.y != stroker->subpath_start.y) {
            error = PVG_FT_Stroker_LineTo(stroker, &stroker->subpath_start);
            if (error) goto Exit;
        }

        /* process the corner */
        stroker->angle_out = stroker->subpath_angle;
        turn = PVG_FT_Angle_Diff(stroker->angle_in, stroker->angle_out);

        /* no specific corner processing is required if the turn is 0 */
        if (turn != 0) {
            /* when we turn to the right, the inside side is 0 */
            inside_side = 0;

            /* otherwise, the inside side is 1 */
            if (turn < 0) inside_side = 1;

            error = ft_stroker_inside(stroker, inside_side,
                                      stroker->subpath_line_length);
            if (error) goto Exit;

            /* process the outside side */
            error = ft_stroker_outside(stroker, 1 - inside_side,
                                       stroker->subpath_line_length);
            if (error) goto Exit;
        }

        /* then end our two subpaths */
        ft_stroke_border_close(stroker->borders + 0, FALSE);
        ft_stroke_border_close(stroker->borders + 1, TRUE);
    }

Exit:
    return error;
}